

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSplit.c
# Opt level: O3

Vec_Int_t * Spl_ManFromWecMapping(Gia_Man_t *p,Vec_Wec_t *vMap)

{
  Vec_Int_t *pVVar1;
  Vec_Int_t *p_00;
  int *__ptr;
  long lVar2;
  int Counter;
  int iVar3;
  size_t __size;
  ulong uVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  
  if (p->vMapping2 == (Vec_Wec_t *)0x0) {
    __assert_fail("Gia_ManHasMapping2(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaSplit.c"
                  ,0x52,"Vec_Int_t *Spl_ManFromWecMapping(Gia_Man_t *, Vec_Wec_t *)");
  }
  uVar8 = p->nObjs;
  uVar4 = (ulong)vMap->nSize;
  if ((long)uVar4 < 1) {
    iVar3 = 0;
    uVar7 = uVar8;
  }
  else {
    lVar2 = 0;
    iVar6 = 0;
    do {
      iVar6 = iVar6 + *(int *)((long)&vMap->pArray->nSize + lVar2);
      lVar2 = lVar2 + 0x10;
    } while (uVar4 << 4 != lVar2);
    lVar2 = 0;
    iVar3 = 0;
    do {
      iVar3 = iVar3 + (uint)(0 < *(int *)((long)&vMap->pArray->nSize + lVar2));
      lVar2 = lVar2 + 0x10;
    } while (uVar4 << 4 != lVar2);
    iVar3 = iVar3 * 2;
    uVar7 = iVar6 + uVar8;
  }
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < iVar3 + -1 + uVar7) {
    iVar6 = iVar3 + uVar7;
  }
  p_00->nCap = iVar6;
  if (iVar6 == 0) {
    p_00->pArray = (int *)0x0;
    if ((int)uVar8 < 1) goto LAB_00782cef;
    __size = (ulong)uVar8 * 4;
LAB_00782cbc:
    __ptr = (int *)malloc(__size);
LAB_00782cc4:
    p_00->pArray = __ptr;
    if (__ptr == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    p_00->nCap = uVar8;
  }
  else {
    __ptr = (int *)malloc((long)iVar6 << 2);
    p_00->pArray = __ptr;
    if (iVar6 < (int)uVar8) {
      __size = (long)(int)uVar8 << 2;
      if (__ptr == (int *)0x0) goto LAB_00782cbc;
      __ptr = (int *)realloc(__ptr,__size);
      goto LAB_00782cc4;
    }
  }
  if (0 < (int)uVar8) {
    memset(__ptr,0,(ulong)uVar8 * 4);
    uVar4 = (ulong)(uint)vMap->nSize;
  }
LAB_00782cef:
  p_00->nSize = uVar8;
  if (0 < (int)uVar4) {
    lVar2 = 0;
    do {
      pVVar1 = vMap->pArray;
      if (0 < pVVar1[lVar2].nSize) {
        if (p_00->nSize <= lVar2) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        p_00->pArray[lVar2] = p_00->nSize;
        Vec_IntPush(p_00,pVVar1[lVar2].nSize);
        if (0 < pVVar1[lVar2].nSize) {
          lVar5 = 0;
          do {
            Vec_IntPush(p_00,pVVar1[lVar2].pArray[lVar5]);
            lVar5 = lVar5 + 1;
          } while (lVar5 < pVVar1[lVar2].nSize);
        }
        Vec_IntPush(p_00,(int)lVar2);
        uVar4 = (ulong)(uint)vMap->nSize;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < (int)uVar4);
    uVar8 = p_00->nSize;
  }
  if ((0xf < (int)uVar8) && (uVar8 != p_00->nCap)) {
    __assert_fail("Vec_IntSize(vMapping) < 16 || Vec_IntSize(vMapping) == Vec_IntCap(vMapping)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaSplit.c"
                  ,0x5e,"Vec_Int_t *Spl_ManFromWecMapping(Gia_Man_t *, Vec_Wec_t *)");
  }
  return p_00;
}

Assistant:

Vec_Int_t * Spl_ManFromWecMapping( Gia_Man_t * p, Vec_Wec_t * vMap )
{
    Vec_Int_t * vMapping, * vVec; int i, k, Obj;
    assert( Gia_ManHasMapping2(p) );
    vMapping = Vec_IntAlloc( Gia_ManObjNum(p) + Vec_WecSizeSize(vMap) + 2*Vec_WecSizeUsed(vMap) );
    Vec_IntFill( vMapping, Gia_ManObjNum(p), 0 );
    Vec_WecForEachLevel( vMap, vVec, i )
        if ( Vec_IntSize(vVec) > 0 )
        {
            Vec_IntWriteEntry( vMapping, i, Vec_IntSize(vMapping) );
            Vec_IntPush( vMapping, Vec_IntSize(vVec) );
            Vec_IntForEachEntry( vVec, Obj, k )
                Vec_IntPush( vMapping, Obj );
            Vec_IntPush( vMapping, i );
        }
    assert( Vec_IntSize(vMapping) < 16 || Vec_IntSize(vMapping) == Vec_IntCap(vMapping) );
    return vMapping;
}